

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void TraceBackwards(uint16_t *dist_array,int dist_array_size,uint16_t **chosen_path,
                   int *chosen_path_size)

{
  ushort uVar1;
  int k;
  uint16_t *cur;
  uint16_t *path;
  int *chosen_path_size_local;
  uint16_t **chosen_path_local;
  int dist_array_size_local;
  uint16_t *dist_array_local;
  
  path = dist_array + dist_array_size;
  for (cur = dist_array + (long)dist_array_size + -1; dist_array <= cur;
      cur = cur + -(long)(int)(uint)uVar1) {
    uVar1 = *cur;
    path = path + -1;
    *path = uVar1;
  }
  *chosen_path = path;
  *chosen_path_size = (int)((long)dist_array + ((long)dist_array_size * 2 - (long)path) >> 1);
  return;
}

Assistant:

static void TraceBackwards(uint16_t* const dist_array,
                           int dist_array_size,
                           uint16_t** const chosen_path,
                           int* const chosen_path_size) {
  uint16_t* path = dist_array + dist_array_size;
  uint16_t* cur = dist_array + dist_array_size - 1;
  while (cur >= dist_array) {
    const int k = *cur;
    --path;
    *path = k;
    cur -= k;
  }
  *chosen_path = path;
  *chosen_path_size = (int)(dist_array + dist_array_size - path);
}